

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
     ::DeleteHeapBlockList
               (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list,
               Recycler *recycler)

{
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list,(anon_class_8_1_b8cf05bd)recycler);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::DeleteHeapBlockList(TBlockType * list, Recycler * recycler)
{
    HeapBlockList::ForEachEditing(list, [recycler](TBlockType * heapBlock)
    {
#if DBG
        heapBlock->ReleasePagesShutdown(recycler);
#endif
        TBlockType::Delete(heapBlock);
    });
}